

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O2

ConstantAggregate * LLVMBC::dyn_cast<LLVMBC::ConstantAggregate>(Value *value)

{
  ValueKind VVar1;
  ConstantAggregate *this;
  ConstantAggregate *pCVar2;
  
  if (value != (Value *)0x0) {
    this = (ConstantAggregate *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)this);
    pCVar2 = (ConstantAggregate *)0x0;
    if (VVar1 == ConstantAggregate) {
      pCVar2 = this;
    }
    return pCVar2;
  }
  return (ConstantAggregate *)0x0;
}

Assistant:

inline T *dyn_cast(Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<T *>(value);
	else
		return nullptr;
}